

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Vec_Int_t * Acb_NtkFindNodes2(Acb_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vNodes;
  int *piVar3;
  long lVar4;
  
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  piVar3 = (int *)malloc(4000);
  vNodes->pArray = piVar3;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar3 = (p->vObjTrav).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (0 < (p->vCos).nSize) {
    lVar4 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar4];
      if ((long)iVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vObjFans).pArray[iVar2];
      if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Acb_NtkFindNodes2_rec(p,(p->vFanSto).pArray[(long)iVar2 + 1],vNodes);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vCos).nSize);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Acb_NtkFindNodes2( Acb_Ntk_t * p )
{
    int i, iObj;
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCo( p, iObj, i )
        Acb_NtkFindNodes2_rec( p, Acb_ObjFanin(p, iObj, 0), vNodes );
    return vNodes;
}